

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

bool Potassco::detail::find_kv(EnumClass *e,StringSpan *sKey,int *iKey,StringSpan *sOut,int *iOut)

{
  bool bVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  char cVar6;
  char *local_50;
  int *local_48;
  StringSpan *local_40;
  int local_38 [2];
  
  iVar5 = e->min;
  pcVar4 = e->rep;
  local_48 = iOut;
  local_40 = sOut;
  while( true ) {
    __n = strcspn(pcVar4," ,=");
    for (pcVar3 = pcVar4 + __n; cVar6 = *pcVar3, cVar6 == ' '; pcVar3 = pcVar3 + 1) {
    }
    if (cVar6 == '=') {
      local_50 = pcVar3 + 1;
      bVar1 = parseSigned(&local_50,(longlong *)local_38,-0x80000000,0x7fffffff);
      pcVar3 = local_50 + -1;
      do {
        cVar6 = pcVar3[1];
        pcVar3 = pcVar3 + 1;
      } while (cVar6 == ' ');
      if (bVar1) {
        iVar5 = local_38[0];
      }
    }
    if (((iKey != (int *)0x0) && (iVar5 == *iKey)) ||
       ((sKey != (StringSpan *)0x0 &&
        ((sKey->size == __n && (iVar2 = strncmp(pcVar4,sKey->first,__n), iVar2 == 0)))))) break;
    if (cVar6 != ',') {
      return false;
    }
    do {
      pcVar4 = pcVar3 + 1;
      pcVar3 = pcVar3 + 1;
    } while (*pcVar4 == ' ');
    iVar5 = iVar5 + 1;
    pcVar4 = pcVar3;
  }
  if (local_48 != (int *)0x0) {
    *local_48 = iVar5;
  }
  if (local_40 == (StringSpan *)0x0) {
    return true;
  }
  local_40->first = pcVar4;
  local_40->size = __n;
  return true;
}

Assistant:

bool find_kv(const EnumClass& e, const StringSpan* sKey, const int* iKey, StringSpan* sOut, int* iOut) {
#define SKIPWS(x) while (*(x) == ' ')  ++(x)
	const char* args = e.rep;
	for (int cVal = e.min;; ++cVal) {
		std::size_t s = std::strcspn(args, " ,=");
		const char* v = args + s;
		SKIPWS(v);
		if (*v == '=') { xconvert(v+1, cVal, &v, ','); SKIPWS(v); }
		if ((iKey && cVal == *iKey) || (sKey && sKey->size == s && std::strncmp(args, sKey->first, s) == 0)) {
			if (iOut) { *iOut = cVal; }
			if (sOut) { *sOut = toSpan(args, s); }
			return true;
		}
		if (*(args = v)++ != ',') {
			return false;
		}
		SKIPWS(args);
	}
#undef SKIPWS
}